

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Expression * __thiscall Parser::parseExpression(Parser *this)

{
  FILE *pFVar1;
  bool bVar2;
  __type_conflict _Var3;
  PrimaryExpression *p1;
  iterator iVar4;
  Operate *o;
  PrimaryExpression *p2;
  Expression *this_00;
  string *this_01;
  key_type local_d0;
  string p2Type;
  string p1Type;
  key_type local_70;
  undefined8 local_50 [4];
  
  p1 = parsePrimaryExpression(this);
  (*(p1->super_AST)._vptr_AST[3])(&p1Type,p1);
  pFVar1 = _stderr;
  if (p1Type._M_string_length == 0) {
    (**(p1->super_AST)._vptr_AST)(&p2Type,p1);
    this_01 = &p2Type;
    fprintf(pFVar1,"\x1b[31m\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n\x1b[0m",
            p2Type._M_dataplus._M_p,p1Type._M_dataplus._M_p);
    goto LAB_00114616;
  }
  bVar2 = std::operator==(&p1Type,"STRING");
  if (bVar2) {
LAB_001142b0:
    (**(p1->super_AST)._vptr_AST)(&p2Type,p1);
    bVar2 = checkVarExists(this,&p2Type);
    std::__cxx11::string::~string((string *)&p2Type);
    if (bVar2) {
      (**(p1->super_AST)._vptr_AST)(&local_d0,p1);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
              ::find(&(this->var_table)._M_t,&local_d0);
      (*(code *)**(undefined8 **)iVar4._M_node[2]._M_left)(&p2Type);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&p1Type,&p2Type);
      std::__cxx11::string::~string((string *)&p2Type);
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  else {
    bVar2 = std::operator==(&p1Type,"CHAR");
    if (bVar2) goto LAB_001142b0;
  }
  Scanner::toUpper(&p2Type,&p1Type);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&p1Type,&p2Type);
  std::__cxx11::string::~string((string *)&p2Type);
  o = parseOperator(this);
  p2 = parsePrimaryExpression(this);
  (*(p2->super_AST)._vptr_AST[3])(&p2Type,p2);
  pFVar1 = _stderr;
  if (p2Type._M_string_length == 0) {
    (**(p2->super_AST)._vptr_AST)(&local_d0,p2);
    this_01 = &local_d0;
    fprintf(pFVar1,"\x1b[31m\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n\x1b[0m",
            local_d0._M_dataplus._M_p,p2Type._M_dataplus._M_p);
    goto LAB_00114616;
  }
  bVar2 = std::operator==(&p2Type,"STRING");
  if (bVar2) {
LAB_001143ac:
    (**(p2->super_AST)._vptr_AST)(&local_d0,p2);
    bVar2 = checkVarExists(this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    if (bVar2) {
      (**(p2->super_AST)._vptr_AST)(&local_70,p2);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
              ::find(&(this->var_table)._M_t,&local_70);
      (*(code *)**(undefined8 **)iVar4._M_node[2]._M_left)(&local_d0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&p2Type,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  else {
    bVar2 = std::operator==(&p2Type,"CHAR");
    if (bVar2) goto LAB_001143ac;
  }
  Scanner::toUpper(&local_d0,&p2Type);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&p2Type,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  _Var3 = std::operator==(&p2Type,&p1Type);
  if (_Var3) {
    bVar2 = std::operator==(&p1Type,"STRING");
    if (!bVar2) {
      bVar2 = std::operator==(&p1Type,"CHAR");
      if (!bVar2) goto LAB_001144c2;
    }
    (**(o->super_Terminal).super_AST._vptr_AST)(&local_d0,o);
    bVar2 = std::operator==(&local_d0,"+");
    std::__cxx11::string::~string((string *)&local_d0);
    pFVar1 = _stderr;
    if (bVar2) goto LAB_001144c2;
    (**(o->super_Terminal).super_AST._vptr_AST)(&local_d0,o);
    (**(p1->super_AST)._vptr_AST)(&local_70,p1);
    (**(p2->super_AST)._vptr_AST)(local_50,p2);
    fprintf(pFVar1,"\x1b[31m\nFATAL: Invalid Operator \'%s\' for Strings \'%s\' and \'%s\'\n\x1b[0m"
            ,local_d0._M_dataplus._M_p,local_70._M_dataplus._M_p,local_50[0]);
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
LAB_001144c2:
    _Var3 = std::operator==(&p1Type,&p2Type);
    pFVar1 = _stderr;
    if (_Var3) {
      fprintf(_stdout,
              "\x1b[32m\t = PrimaryExpression1 [Type \'%s\'] matches PrimaryExpression2 [Type \'%s\']\n\x1b[0m"
              ,p1Type._M_dataplus._M_p,p2Type._M_dataplus._M_p);
      this_00 = (Expression *)operator_new(0x20);
      Expression::Expression(this_00,p1,p2,o);
      std::__cxx11::string::~string((string *)&p2Type);
      std::__cxx11::string::~string((string *)&p1Type);
      return this_00;
    }
    (**(p1->super_AST)._vptr_AST)(&local_d0,p1);
    (**(p2->super_AST)._vptr_AST)(&local_70,p2);
    fprintf(pFVar1,
            "\x1b[31m\nFATAL: Incompatible types: \nP1: %s [Type \'%s\']\nP2: %s [Type \'%s\']\n\x1b[0m"
            ,local_d0._M_dataplus._M_p,p1Type._M_dataplus._M_p,local_70._M_dataplus._M_p,
            p2Type._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_70);
  this_01 = &local_d0;
LAB_00114616:
  std::__cxx11::string::~string((string *)this_01);
  exit(1);
}

Assistant:

Expression *Parser::parseExpression() {
    // parse primary expression
    PrimaryExpression *p1 = parsePrimaryExpression();
    std::string p1Type = p1->getType();
    if (p1Type.length() == 0) {
        fprintf(stderr, ANSI_COLOR_RED "\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1->describe().data(), p1Type.data());
        exit(1);
    }
    // Check if variable/expression defined in vartable, then change data type appropriately
    if (p1Type == "STRING" || p1Type == "CHAR") {
        if (checkVarExists(p1->describe())) {
            p1Type = var_table.find(p1->describe())->second.type->describe();
        }
    }
    p1Type = Scanner::toUpper(p1Type);

    // parse operator
    Operate *o1 = parseOperator();

    // parse primary expression
    PrimaryExpression *p2 = parsePrimaryExpression();
    std::string p2Type = p2->getType();
    if (p2Type.length() == 0) {
        fprintf(stderr, ANSI_COLOR_RED "\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n" ANSI_COLOR_RESET,
                p2->describe().data(), p2Type.data());
        exit(1);
    }
    // Check if variable/expression defined in vartable, then change data type appropriately
    if (p2Type == "STRING" || p2Type == "CHAR") {
        if (checkVarExists(p2->describe())) {
            p2Type = var_table.find(p2->describe())->second.type->describe();
        }
    }
    p2Type = Scanner::toUpper(p2Type);

    // Check + is used with strings or chars
    if (p2Type == p1Type && (p1Type == "STRING" || p1Type == "CHAR") && o1->describe() != "+") {
        fprintf(stderr,
                ANSI_COLOR_RED "\nFATAL: Invalid Operator \'%s\' for Strings \'%s\' and \'%s\'\n" ANSI_COLOR_RESET,
                o1->describe().data(), p1->describe().data(), p2->describe().data());
        exit(1);
    }

    // Check incompatible types
    if (p1Type != p2Type) {
        fprintf(stderr,
                ANSI_COLOR_RED "\nFATAL: Incompatible types: \nP1: %s [Type \'%s\']\nP2: %s [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1->describe().data(), p1Type.data(), p2->describe().data(), p2Type.data());
        exit(1);
    }

    if (_VERBOSITY >= 3) {
        fprintf(stdout,
                ANSI_COLOR_GREEN "\t = PrimaryExpression1 [Type \'%s\'] matches PrimaryExpression2 [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1Type.data(), p2Type.data());
    }

    // Build Expression
    return new Expression(p1, p2, o1);
}